

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truc_policy.cpp
# Opt level: O2

optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
* SingleTRUCChecks_abi_cxx11_
            (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
             *__return_storage_ptr__,CTransactionRef *ptx,setEntries *mempool_ancestors,
            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
            *direct_conflicts,int64_t vsize)

{
  _Base_ptr p_Var1;
  element_type *peVar2;
  size_t sVar3;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Base_ptr p_Var6;
  size_type sVar7;
  _Rb_tree_node_base *p_Var8;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long in_FS_OFFSET;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_128;
  undefined1 local_110 [8];
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  element_type *local_e8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar2 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vsize;
  local_110 = (undefined1  [8])vsize;
  for (p_Var6 = p_Var1;
      (_Rb_tree_header *)p_Var6 != &(mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    if (peVar2->version != 3) {
      if (*(int *)(**(long **)(p_Var6 + 1) + 0x30) != 3) goto LAB_007c6c67;
      base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)&peVar2->hash);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_98,
                 (base_blob<256u> *)
                 &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_witness_hash);
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_128,
                 *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)(p_Var6 + 1));
      base_blob<256u>::ToString_abi_cxx11_(&local_b8,(base_blob<256u> *)&(local_128._M_ptr)->hash);
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_138,
                 *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)(p_Var6 + 1));
      base_blob<256u>::ToString_abi_cxx11_
                (&local_d8,(base_blob<256u> *)&(local_138._M_ptr)->m_witness_hash);
      tinyformat::
      format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (&local_58,
                 (tinyformat *)
                 "non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                 (char *)&local_78,&local_98,&local_b8,&local_d8,in_stack_fffffffffffffea8);
      local_108._0_8_ = &local_f8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        local_f8._8_4_ = local_58.field_2._8_4_;
        local_f8._12_4_ = local_58.field_2._12_4_;
      }
      else {
        local_108._0_8_ = local_58._M_dataplus._M_p;
      }
      local_108._8_8_ = local_58._M_string_length;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity._0_4_ =
           local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_e8 = (element_type *)0x0;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::
      _Optional_payload_base<std::pair<std::__cxx11::string,std::shared_ptr<CTransaction_const>>>::
      _Optional_payload_base<std::pair<std::__cxx11::string,decltype(nullptr)>>
                ((_Optional_payload_base<std::pair<std::__cxx11::string,std::shared_ptr<CTransaction_const>>>
                  *)__return_storage_ptr__);
LAB_007c6ff2:
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
      goto LAB_007c725c;
    }
    if (*(int *)(**(long **)(p_Var6 + 1) + 0x30) != 3) {
      base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)&peVar2->hash);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_98,
                 (base_blob<256u> *)
                 &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_witness_hash);
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_128,
                 *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)(p_Var6 + 1));
      base_blob<256u>::ToString_abi_cxx11_(&local_b8,(base_blob<256u> *)&(local_128._M_ptr)->hash);
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_138,
                 *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)(p_Var6 + 1));
      base_blob<256u>::ToString_abi_cxx11_
                (&local_d8,(base_blob<256u> *)&(local_138._M_ptr)->m_witness_hash);
      tinyformat::
      format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (&local_58,
                 (tinyformat *)
                 "version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                 (char *)&local_78,&local_98,&local_b8,&local_d8,in_stack_fffffffffffffea8);
      local_108._0_8_ = &local_f8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        local_f8._8_4_ = local_58.field_2._8_4_;
        local_f8._12_4_ = local_58.field_2._12_4_;
      }
      else {
        local_108._0_8_ = local_58._M_dataplus._M_p;
      }
      local_108._8_8_ = local_58._M_string_length;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity._0_4_ =
           local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_e8 = (element_type *)0x0;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::
      _Optional_payload_base<std::pair<std::__cxx11::string,std::shared_ptr<CTransaction_const>>>::
      _Optional_payload_base<std::pair<std::__cxx11::string,decltype(nullptr)>>
                ((_Optional_payload_base<std::pair<std::__cxx11::string,std::shared_ptr<CTransaction_const>>>
                  *)__return_storage_ptr__);
      goto LAB_007c6ff2;
    }
LAB_007c6c67:
  }
  if (peVar2->version != 3) goto LAB_007c71fc;
  if (vsize < 0x2711) {
    sVar3 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    if (0xfffffffffffffffc < sVar3 - 2) {
      if (sVar3 != 0) {
        if (1000 < vsize) {
          base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)&peVar2->hash);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_98,
                     (base_blob<256u> *)
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_witness_hash);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
                    (&local_58,
                     (tinyformat *)
                     "version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                     (char *)&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &TRUC_CHILD_MAX_VSIZE,(long *)in_stack_fffffffffffffea8);
          local_108._0_8_ = &local_f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == &local_58.field_2) {
            local_f8._8_4_ = local_58.field_2._8_4_;
            local_f8._12_4_ = local_58.field_2._12_4_;
          }
          else {
            local_108._0_8_ = local_58._M_dataplus._M_p;
          }
          local_108._8_8_ = local_58._M_string_length;
          local_58._M_string_length = 0;
          local_58.field_2._M_allocated_capacity._0_4_ =
               local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
          local_e8 = (element_type *)0x0;
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::
          _Optional_payload_base<std::pair<std::__cxx11::string,std::shared_ptr<CTransaction_const>>>
          ::_Optional_payload_base<std::pair<std::__cxx11::string,decltype(nullptr)>>
                    ((_Optional_payload_base<std::pair<std::__cxx11::string,std::shared_ptr<CTransaction_const>>>
                      *)__return_storage_ptr__);
          goto LAB_007c7245;
        }
        p_Var4 = *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 1);
        if (p_Var4[6]._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar10 = false;
          p_Var9 = p_Var4;
        }
        else {
          for (p_Var8 = (_Rb_tree_node_base *)p_Var4[5]._M_refcount._M_pi;
              bVar10 = p_Var8 != (_Rb_tree_node_base *)&p_Var4[4]._M_refcount, bVar10;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            sVar7 = std::
                    set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                    ::count(direct_conflicts,(key_type *)(**(long **)(p_Var8 + 1) + 0x39));
            if (sVar7 != 0) break;
          }
          p_Var9 = *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 1);
        }
        if ((!bVar10) &&
           (p_Var5 = p_Var9[0xc]._M_refcount._M_pi,
           (undefined1 *)0x2 < (undefined1 *)((long)&p_Var5->_vptr__Sp_counted_base + 1U))) {
          if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2) {
            bVar10 = p_Var4[5]._M_refcount._M_pi[2]._vptr__Sp_counted_base[0x1c] == (_func_int *)0x2
            ;
          }
          else {
            bVar10 = false;
          }
          std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,
                     p_Var9);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_78,(base_blob<256u> *)(local_b8._M_dataplus._M_p + 0x39));
          std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_d8,
                     *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 1))
          ;
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_98,(base_blob<256u> *)(local_d8._M_dataplus._M_p + 0x59));
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_58,(tinyformat *)"tx %u (wtxid=%s) would exceed descendant count limit",
                     (char *)&local_78,&local_98,args_1);
          if (bVar10) {
            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_128,
                       (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                       p_Var4[5]._M_refcount._M_pi[2]._vptr__Sp_counted_base);
          }
          else {
            local_128._M_ptr = (element_type *)0x0;
            local_128._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>
                      *)local_108,&local_58,(shared_ptr<const_CTransaction> *)&local_128);
          std::
          optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
          ::
          optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true>
                    (__return_storage_ptr__,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>
                      *)local_108);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>
                   *)local_108);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_98);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
          std::__cxx11::string::~string((string *)&local_78);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length);
          goto LAB_007c7276;
        }
      }
LAB_007c71fc:
      (__return_storage_ptr__->
      super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
      ._M_engaged = false;
      goto LAB_007c7276;
    }
    base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)&peVar2->hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_98,
               (base_blob<256u> *)
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_58,(tinyformat *)"tx %s (wtxid=%s) would have too many ancestors",
               (char *)&local_78,&local_98,args_1);
    local_108._0_8_ = &local_f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      local_f8._8_4_ = local_58.field_2._8_4_;
      local_f8._12_4_ = local_58.field_2._12_4_;
    }
    else {
      local_108._0_8_ = local_58._M_dataplus._M_p;
    }
    local_108._8_8_ = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity._0_4_ =
         local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_e8 = (element_type *)0x0;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::_Optional_payload_base<std::pair<std::__cxx11::string,std::shared_ptr<CTransaction_const>>>
    ::_Optional_payload_base<std::pair<std::__cxx11::string,decltype(nullptr)>>
              ((_Optional_payload_base<std::pair<std::__cxx11::string,std::shared_ptr<CTransaction_const>>>
                *)__return_storage_ptr__);
  }
  else {
    base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)&peVar2->hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_98,
               (base_blob<256u> *)
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
              (&local_58,
               (tinyformat *)"version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
               (char *)&local_78,&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
               &TRUC_MAX_VSIZE,(long *)in_stack_fffffffffffffea8);
    local_108._0_8_ = &local_f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      local_f8._8_4_ = local_58.field_2._8_4_;
      local_f8._12_4_ = local_58.field_2._12_4_;
    }
    else {
      local_108._0_8_ = local_58._M_dataplus._M_p;
    }
    local_108._8_8_ = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity._0_4_ =
         local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_e8 = (element_type *)0x0;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::_Optional_payload_base<std::pair<std::__cxx11::string,std::shared_ptr<CTransaction_const>>>
    ::_Optional_payload_base<std::pair<std::__cxx11::string,decltype(nullptr)>>
              ((_Optional_payload_base<std::pair<std::__cxx11::string,std::shared_ptr<CTransaction_const>>>
                *)__return_storage_ptr__);
  }
LAB_007c7245:
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&local_58);
LAB_007c725c:
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
LAB_007c7276:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<std::string, CTransactionRef>> SingleTRUCChecks(const CTransactionRef& ptx,
                                          const CTxMemPool::setEntries& mempool_ancestors,
                                          const std::set<Txid>& direct_conflicts,
                                          int64_t vsize)
{
    // Check TRUC and non-TRUC inheritance.
    for (const auto& entry : mempool_ancestors) {
        if (ptx->version != TRUC_VERSION && entry->GetTx().version == TRUC_VERSION) {
            return std::make_pair(strprintf("non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                             entry->GetSharedTx()->GetHash().ToString(), entry->GetSharedTx()->GetWitnessHash().ToString()),
                nullptr);
        } else if (ptx->version == TRUC_VERSION && entry->GetTx().version != TRUC_VERSION) {
            return std::make_pair(strprintf("version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                             entry->GetSharedTx()->GetHash().ToString(), entry->GetSharedTx()->GetWitnessHash().ToString()),
                nullptr);
        }
    }

    // This function is specialized for these limits, and must be reimplemented if they ever change.
    static_assert(TRUC_ANCESTOR_LIMIT == 2);
    static_assert(TRUC_DESCENDANT_LIMIT == 2);

    // The rest of the rules only apply to transactions with version=3.
    if (ptx->version != TRUC_VERSION) return std::nullopt;

    if (vsize > TRUC_MAX_VSIZE) {
        return std::make_pair(strprintf("version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                         ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(), vsize, TRUC_MAX_VSIZE),
            nullptr);
    }

    // Check that TRUC_ANCESTOR_LIMIT would not be violated.
    if (mempool_ancestors.size() + 1 > TRUC_ANCESTOR_LIMIT) {
        return std::make_pair(strprintf("tx %s (wtxid=%s) would have too many ancestors",
                         ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString()),
            nullptr);
    }

    // Remaining checks only pertain to transactions with unconfirmed ancestors.
    if (mempool_ancestors.size() > 0) {
        // If this transaction spends TRUC parents, it cannot be too large.
        if (vsize > TRUC_CHILD_MAX_VSIZE) {
            return std::make_pair(strprintf("version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(), vsize, TRUC_CHILD_MAX_VSIZE),
                nullptr);
        }

        // Check the descendant counts of in-mempool ancestors.
        const auto& parent_entry = *mempool_ancestors.begin();
        // If there are any ancestors, this is the only child allowed. The parent cannot have any
        // other descendants. We handle the possibility of multiple children as that case is
        // possible through a reorg.
        const auto& children = parent_entry->GetMemPoolChildrenConst();
        // Don't double-count a transaction that is going to be replaced. This logic assumes that
        // any descendant of the TRUC transaction is a direct child, which makes sense because a
        // TRUC transaction can only have 1 descendant.
        const bool child_will_be_replaced = !children.empty() &&
            std::any_of(children.cbegin(), children.cend(),
                [&direct_conflicts](const CTxMemPoolEntry& child){return direct_conflicts.count(child.GetTx().GetHash()) > 0;});
        if (parent_entry->GetCountWithDescendants() + 1 > TRUC_DESCENDANT_LIMIT && !child_will_be_replaced) {
            // Allow sibling eviction for TRUC transaction: if another child already exists, even if
            // we don't conflict inputs with it, consider evicting it under RBF rules. We rely on TRUC rules
            // only permitting 1 descendant, as otherwise we would need to have logic for deciding
            // which descendant to evict. Skip if this isn't true, e.g. if the transaction has
            // multiple children or the sibling also has descendants due to a reorg.
            const bool consider_sibling_eviction{parent_entry->GetCountWithDescendants() == 2 &&
                children.begin()->get().GetCountWithAncestors() == 2};

            // Return the sibling if its eviction can be considered. Provide the "descendant count
            // limit" string either way, as the caller may decide not to do sibling eviction.
            return std::make_pair(strprintf("tx %u (wtxid=%s) would exceed descendant count limit",
                                            parent_entry->GetSharedTx()->GetHash().ToString(),
                                            parent_entry->GetSharedTx()->GetWitnessHash().ToString()),
                                  consider_sibling_eviction ?  children.begin()->get().GetSharedTx() : nullptr);
        }
    }
    return std::nullopt;
}